

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Ray * __thiscall
phyr::Transform::operator()(Transform *this,Ray *r,Vector3f *roAbsError,Vector3f *rdAbsError)

{
  Vector3<double> *in_RCX;
  Vector3<double> *in_RDX;
  Vector3<double> *in_RSI;
  Ray *in_RDI;
  Transform *unaff_retaddr;
  Vector3<double> *in_stack_00000020;
  Point3<double> *in_stack_00000028;
  Transform *in_stack_00000030;
  double factor;
  double lengthSq;
  double tMax;
  Vector3f d;
  Point3f o;
  double in_stack_ffffffffffffff48;
  Ray *this_00;
  Vector3<double> local_98;
  Vector3<double> local_80;
  double local_68;
  double local_60;
  double local_58;
  Vector3<double> local_50;
  Point3<double> local_38;
  Vector3<double> *local_18;
  Vector3<double> *v;
  
  this_00 = in_RDI;
  local_18 = in_RCX;
  v = in_RSI;
  operator()(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  operator()(unaff_retaddr,v,in_RDX);
  local_58 = in_RDX[2].x;
  local_60 = Vector3<double>::lengthSquared(&local_50);
  if (0.0 < local_60) {
    abs<double>(in_RSI);
    local_68 = dot<double>(&local_80,local_18);
    local_68 = local_68 / local_60;
    Vector3<double>::operator*((Vector3<double> *)this_00,in_stack_ffffffffffffff48);
    Point3<double>::operator+=(&local_38,&local_98);
  }
  Ray::Ray(this_00,&local_38,&local_50,local_58);
  return in_RDI;
}

Assistant:

inline Ray Transform::operator()(const Ray& r, Vector3f* roAbsError, Vector3f* rdAbsError) const {
    // Transform ray origin and direction
    Point3f o = (*this)(r.o, roAbsError);
    Vector3f d = (*this)(r.d, rdAbsError);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), *roAbsError) / lengthSq;
        o += d * factor; // tMax -= factor;
    }

    return Ray(o, d, tMax);
}